

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall
Fl_Table::get_bounds(Fl_Table *this,TableContext context,int *X,int *Y,int *W,int *H)

{
  int iVar1;
  int *H_local;
  int *W_local;
  int *Y_local;
  int *X_local;
  TableContext context_local;
  Fl_Table *this_local;
  
  if (context == CONTEXT_ROW_HEADER) {
    *X = this->wix;
    *Y = this->toy;
    iVar1 = row_header_width(this);
    *W = iVar1;
    *H = this->toh;
  }
  else if (context == CONTEXT_COL_HEADER) {
    *X = this->tox;
    *Y = this->wiy;
    *W = this->tow;
    iVar1 = col_header_height(this);
    *H = iVar1;
  }
  else if (context == CONTEXT_TABLE) {
    *X = this->tix;
    *Y = this->tiy;
    *W = this->tiw;
    *H = this->tih;
  }
  else {
    fprintf(_stderr,"Fl_Table::get_bounds(): context %d unimplemented\n",(ulong)context);
  }
  return;
}

Assistant:

void Fl_Table::get_bounds(TableContext context, int &X, int &Y, int &W, int &H) {
  switch ( context ) {
    case CONTEXT_COL_HEADER:
      // Column header clipping.
      X = tox;
      Y = wiy;
      W = tow;
      H = col_header_height();
      return;
      
    case CONTEXT_ROW_HEADER:
      // Row header clipping.
      X = wix;
      Y = toy;
      W = row_header_width();
      H = toh;
      return;
      
    case CONTEXT_TABLE:
      // Table inner dimensions
      X = tix; Y = tiy; W = tiw; H = tih;
      return;
      
      // TODO: Add other contexts..
    default:
      fprintf(stderr, "Fl_Table::get_bounds(): context %d unimplemented\n", (int)context);
      return;
  }
  //NOTREACHED
}